

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

char * get_http_string(Curl_easy *data,connectdata *conn)

{
  _Bool _Var1;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  _Var1 = use_http_1_1plus(data,conn);
  if (_Var1) {
    data_local = (Curl_easy *)0x18cbfb;
  }
  else {
    data_local = (Curl_easy *)0x18af22;
  }
  return (char *)data_local;
}

Assistant:

static const char *get_http_string(const struct Curl_easy *data,
                                   const struct connectdata *conn)
{
#ifdef ENABLE_QUIC
  if((data->set.httpversion == CURL_HTTP_VERSION_3) ||
     (conn->httpversion == 30))
    return "3";
#endif

#ifdef USE_NGHTTP2
  if(conn->proto.httpc.h2)
    return "2";
#endif

  if(use_http_1_1plus(data, conn))
    return "1.1";

  return "1.0";
}